

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O1

String * __thiscall
Rml::StringUtilities::StripWhitespace_abi_cxx11_
          (String *__return_storage_ptr__,StringUtilities *this,StringView string)

{
  StringUtilities *pSVar1;
  StringUtilities *pSVar2;
  
  pSVar1 = (StringUtilities *)string.p_begin;
  pSVar2 = this;
  if (this < pSVar1) {
    do {
      pSVar2 = this;
      if ((0x20 < (ulong)(byte)*this) || ((0x100002600U >> ((ulong)(byte)*this & 0x3f) & 1) == 0))
      break;
      this = this + 1;
      pSVar2 = pSVar1;
    } while (this != pSVar1);
  }
  while( true ) {
    if (pSVar1 <= pSVar2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    if ((0x20 < (ulong)(byte)pSVar1[-1]) ||
       ((0x100002600U >> ((ulong)(byte)pSVar1[-1] & 0x3f) & 1) == 0)) break;
    pSVar1 = pSVar1 + -1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

RMLUICORE_API String StringUtilities::StripWhitespace(StringView string)
{
	const char* start = string.begin();
	const char* end = string.end();

	while (start < end && IsWhitespace(*start))
		start++;

	while (end > start && IsWhitespace(*(end - 1)))
		end--;

	if (start < end)
		return String(start, end);

	return String();
}